

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_model_ex(rf_model model,rf_vec3 position,rf_vec3 rotation_axis,float rotationAngle,
                     rf_vec3 scale,rf_color tint)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  rf_material_map *prVar6;
  rf_mat transform;
  rf_mat left;
  undefined1 auVar7 [56];
  rf_mat left_00;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  rf_mesh mesh;
  rf_material material;
  long lVar8;
  undefined8 unaff_RBX;
  long lVar9;
  undefined8 unaff_RBP;
  rf_mesh *prVar10;
  rf_material *prVar11;
  undefined8 *puVar12;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  rf_mesh *prVar13;
  undefined8 unaff_R15;
  byte bVar14;
  undefined8 unaff_retaddr;
  rf_mat mat_translation;
  rf_mat mat_scale;
  rf_mat mat_transform;
  rf_mat mat_rotation;
  float fStack_204;
  long local_168;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  uint *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  bVar14 = 0;
  local_168 = (ulong)(uint)scale.y << 0x20;
  rf_mat_rotate((rf_mat *)&stack0xffffffffffffff90,rotation_axis,rotationAngle * 0.017453292);
  fStack_204 = position.y;
  auVar7 = ZEXT4456(CONCAT440(scale.z,ZEXT2440(CONCAT816(local_168,ZEXT416((uint)scale.x)))));
  left.m11 = 0.0;
  left.m15 = 1.0;
  left.m0 = (float)auVar7._0_4_;
  left.m4 = (float)auVar7._4_4_;
  left.m8 = (float)auVar7._8_4_;
  left.m12 = (float)auVar7._12_4_;
  left.m1 = (float)auVar7._16_4_;
  left.m5 = (float)auVar7._20_4_;
  left.m9 = (float)auVar7._24_4_;
  left.m13 = (float)auVar7._28_4_;
  left.m2 = (float)auVar7._32_4_;
  left.m6 = (float)auVar7._36_4_;
  left.m10 = (float)auVar7._40_4_;
  left.m14 = (float)auVar7._44_4_;
  left.m3 = (float)auVar7._48_4_;
  left.m7 = (float)auVar7._52_4_;
  right.m8 = (float)in_stack_ffffffffffffff98;
  right.m12 = SUB84(in_stack_ffffffffffffff98,4);
  right.m0 = (float)in_stack_ffffffffffffff90;
  right.m4 = SUB84(in_stack_ffffffffffffff90,4);
  right.m1 = (float)in_stack_ffffffffffffffa0;
  right.m5 = SUB84(in_stack_ffffffffffffffa0,4);
  right.m9 = (float)in_stack_ffffffffffffffa8;
  right.m13 = SUB84(in_stack_ffffffffffffffa8,4);
  right.m2 = (float)in_stack_ffffffffffffffb0;
  right.m6 = SUB84(in_stack_ffffffffffffffb0,4);
  right.m10 = (float)in_stack_ffffffffffffffb8;
  right.m14 = SUB84(in_stack_ffffffffffffffb8,4);
  right.m3 = (float)in_stack_ffffffffffffffc0;
  right.m7 = SUB84(in_stack_ffffffffffffffc0,4);
  right.m11 = (float)in_stack_ffffffffffffffc8;
  right.m15 = SUB84(in_stack_ffffffffffffffc8,4);
  rf_mat_mul(left,right);
  lVar9 = position._0_8_ << 0x20;
  right_00.m14 = position.z;
  right_00.m10 = 1.0;
  left_00.m8 = (float)(int)in_stack_ffffffffffffff18;
  left_00.m12 = (float)(int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  left_00.m0 = (float)(int)in_stack_ffffffffffffff10;
  left_00.m4 = (float)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  left_00.m1 = (float)(int)in_stack_ffffffffffffff20;
  left_00.m5 = (float)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  left_00.m9 = (float)(int)in_stack_ffffffffffffff28;
  left_00.m13 = (float)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  left_00.m2 = (float)(int)in_stack_ffffffffffffff30;
  left_00.m6 = (float)(int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  left_00.m10 = (float)(int)in_stack_ffffffffffffff38;
  left_00.m14 = (float)(int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  left_00.m3 = (float)(int)in_stack_ffffffffffffff40;
  left_00.m7 = (float)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  left_00.m11 = (float)(int)in_stack_ffffffffffffff48;
  left_00.m15 = (float)(int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  right_00.m8 = (float)(int)lVar9;
  right_00.m12 = (float)(int)((ulong)lVar9 >> 0x20);
  right_00.m0 = 1.0;
  right_00.m4 = 0.0;
  right_00.m1 = 0.0;
  right_00.m5 = 1.0;
  right_00.m9 = (float)(int)((ulong)(uint)fStack_204 << 0x20);
  right_00.m13 = (float)(int)(((ulong)(uint)fStack_204 << 0x20) >> 0x20);
  right_00.m2 = 0.0;
  right_00.m6 = 0.0;
  right_00.m3 = 0.0;
  right_00.m7 = 0.0;
  right_00.m11 = 0.0;
  right_00.m15 = 1.0;
  rf_mat_mul(left_00,right_00);
  right_01.m8 = (float)(int)in_stack_ffffffffffffff58;
  right_01.m12 = (float)(int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  right_01.m0 = (float)(int)in_stack_ffffffffffffff50;
  right_01.m4 = (float)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  right_01.m1 = (float)(int)in_stack_ffffffffffffff60;
  right_01.m5 = (float)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  right_01.m9 = (float)(int)in_stack_ffffffffffffff68;
  right_01.m13 = (float)(int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  right_01.m2 = (float)(int)in_stack_ffffffffffffff70;
  right_01.m6 = (float)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  right_01._40_8_ = in_stack_ffffffffffffff78;
  right_01.m3 = (float)(int)in_stack_ffffffffffffff80;
  right_01.m7 = (float)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  right_01.m11 = (float)(int)in_stack_ffffffffffffff88;
  right_01.m15 = (float)(int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  rf_mat_mul(model.transform,right_01);
  if (0 < model.mesh_count) {
    lVar9 = 0;
    prVar13 = model.meshes;
    do {
      prVar6 = model.materials[model.mesh_material[lVar9]].maps;
      bVar1 = (prVar6->color).r;
      bVar2 = (prVar6->color).g;
      bVar3 = (prVar6->color).b;
      bVar4 = (prVar6->color).a;
      (prVar6->color).r =
           (uchar)(int)(((double)bVar1 / 255.0) * ((double)((uint)tint & 0xff) / 255.0) * 255.0);
      (prVar6->color).g =
           (uchar)(int)(((double)bVar2 / 255.0) * ((double)((uint)tint >> 8 & 0xff) / 255.0) * 255.0
                       );
      (prVar6->color).b =
           (uchar)(int)(((double)bVar3 / 255.0) * ((double)((uint)tint >> 0x10 & 0xff) / 255.0) *
                       255.0);
      (prVar6->color).a =
           (uchar)(int)(((double)bVar4 / 255.0) * ((double)((uint)tint >> 0x18) / 255.0) * 255.0);
      iVar5 = model.mesh_material[lVar9];
      prVar10 = prVar13;
      puVar12 = (undefined8 *)&stack0xfffffffffffffca8;
      for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar12 = *(undefined8 *)prVar10;
        prVar10 = (rf_mesh *)((long)prVar10 + (ulong)bVar14 * -0x10 + 8);
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      }
      prVar11 = model.materials + iVar5;
      puVar12 = (undefined8 *)&stack0xfffffffffffffd18;
      for (lVar8 = 0x13; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar12 = *(undefined8 *)&prVar11->shader;
        prVar11 = (rf_material *)((long)prVar11 + (ulong)bVar14 * -0x10 + 8);
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      }
      mesh.vertices = (float *)in_stack_ffffffffffffff18;
      mesh.vertex_count = (int)in_stack_ffffffffffffff10;
      mesh.triangle_count = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      mesh.texcoords = (float *)in_stack_ffffffffffffff20;
      mesh.texcoords2 = (float *)in_stack_ffffffffffffff28;
      mesh.normals = (float *)in_stack_ffffffffffffff30;
      mesh.tangents = (float *)in_stack_ffffffffffffff38;
      mesh.colors = (uchar *)in_stack_ffffffffffffff40;
      mesh.indices = (unsigned_short *)in_stack_ffffffffffffff48;
      mesh.anim_vertices = (float *)in_stack_ffffffffffffff50;
      mesh.anim_normals = (float *)in_stack_ffffffffffffff58;
      mesh.bone_ids = (int *)in_stack_ffffffffffffff60;
      mesh.bone_weights = (float *)in_stack_ffffffffffffff68;
      mesh._96_8_ = in_stack_ffffffffffffff70;
      mesh.vbo_id = in_stack_ffffffffffffff78;
      material.shader.locs[1] = (int)in_stack_ffffffffffffff88;
      material.shader.locs[2] = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      material.shader.id = (int)in_stack_ffffffffffffff80;
      material.shader.locs[0] = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      material.shader.locs[3] = (int)(float)in_stack_ffffffffffffff90;
      material.shader.locs[4] = (int)SUB84(in_stack_ffffffffffffff90,4);
      material.shader.locs[5] = (int)(float)in_stack_ffffffffffffff98;
      material.shader.locs[6] = (int)SUB84(in_stack_ffffffffffffff98,4);
      material.shader.locs[7] = (int)(float)in_stack_ffffffffffffffa0;
      material.shader.locs[8] = (int)SUB84(in_stack_ffffffffffffffa0,4);
      material.shader.locs[9] = (int)(float)in_stack_ffffffffffffffa8;
      material.shader.locs[10] = (int)SUB84(in_stack_ffffffffffffffa8,4);
      material.shader.locs[0xb] = (int)(float)in_stack_ffffffffffffffb0;
      material.shader.locs[0xc] = (int)SUB84(in_stack_ffffffffffffffb0,4);
      material.shader.locs[0xd] = (int)(float)in_stack_ffffffffffffffb8;
      material.shader.locs[0xe] = (int)SUB84(in_stack_ffffffffffffffb8,4);
      material.shader.locs[0xf] = (int)(float)in_stack_ffffffffffffffc0;
      material.shader.locs[0x10] = (int)SUB84(in_stack_ffffffffffffffc0,4);
      material.shader.locs[0x11] = (int)(float)in_stack_ffffffffffffffc8;
      material.shader.locs[0x12] = (int)SUB84(in_stack_ffffffffffffffc8,4);
      material.shader.locs[0x13] = (int)unaff_RBX;
      material.shader.locs[0x14] = (int)((ulong)unaff_RBX >> 0x20);
      material.shader.locs[0x15] = (int)unaff_R12;
      material.shader.locs[0x16] = (int)((ulong)unaff_R12 >> 0x20);
      material.shader.locs[0x17] = (int)unaff_R13;
      material.shader.locs[0x18] = (int)((ulong)unaff_R13 >> 0x20);
      material.shader.locs[0x19] = (int)unaff_R14;
      material.shader.locs[0x1a] = (int)((ulong)unaff_R14 >> 0x20);
      material.shader.locs[0x1b] = (int)unaff_R15;
      material.shader.locs[0x1c] = (int)((ulong)unaff_R15 >> 0x20);
      material.shader.locs[0x1d] = (int)unaff_RBP;
      material.shader.locs[0x1e] = (int)((ulong)unaff_RBP >> 0x20);
      material.maps = (rf_material_map *)local_130;
      material._128_8_ = unaff_retaddr;
      material.params = (float *)uStack_128;
      transform._8_8_ = uStack_118;
      transform._0_8_ = local_120;
      transform._16_8_ = local_110;
      transform._24_8_ = uStack_108;
      transform._32_8_ = local_100;
      transform._40_8_ = uStack_f8;
      transform.m3 = (float)(undefined4)model.mesh_count;
      transform.m7 = (float)model.mesh_count._4_4_;
      transform._56_8_ = model.meshes;
      rf_gfx_draw_mesh(mesh,material,transform);
      prVar6 = model.materials[model.mesh_material[lVar9]].maps;
      (prVar6->color).r = bVar1;
      (prVar6->color).g = bVar2;
      (prVar6->color).b = bVar3;
      (prVar6->color).a = bVar4;
      lVar9 = lVar9 + 1;
      prVar13 = prVar13 + 1;
    } while (model.mesh_count != lVar9);
  }
  return;
}

Assistant:

RF_API void rf_draw_model_ex(rf_model model, rf_vec3 position, rf_vec3 rotation_axis, float rotationAngle, rf_vec3 scale, rf_color tint)
{
    // Calculate transformation matrix from function parameters
    // Get transform matrix (rotation -> scale -> translation)
    rf_mat mat_scale = rf_mat_scale(scale.x, scale.y, scale.z);
    rf_mat mat_rotation = rf_mat_rotate(rotation_axis, rotationAngle * RF_DEG2RAD);
    rf_mat mat_translation = rf_mat_translate(position.x, position.y, position.z);

    rf_mat mat_transform = rf_mat_mul(rf_mat_mul(mat_scale, mat_rotation), mat_translation);

    // Combine model transformation matrix (model.transform) with matrix generated by function parameters (mat_transform)
    model.transform = rf_mat_mul(model.transform, mat_transform);

    for (rf_int i = 0; i < model.mesh_count; i++)
    {
        // TODO: Review color + tint premultiplication mechanism
        rf_color color = model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color;

        rf_color color_tint = RF_WHITE;
        color_tint.r = (((float)color.r/255.0)*((float)tint.r/255.0))*255;
        color_tint.g = (((float)color.g/255.0)*((float)tint.g/255.0))*255;
        color_tint.b = (((float)color.b/255.0)*((float)tint.b/255.0))*255;
        color_tint.a = (((float)color.a/255.0)*((float)tint.a/255.0))*255;

        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color_tint;
        rf_gfx_draw_mesh(model.meshes[i], model.materials[model.mesh_material[i]], model.transform);
        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color;
    }
}